

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O2

UBool __thiscall
icu_63::CollationWeights::allocWeightsInShortRanges
          (CollationWeights *this,int32_t n,int32_t minLength)

{
  int iVar1;
  int iVar2;
  int length;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  UErrorCode errorCode;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)this->rangeCount;
  if (this->rangeCount < 1) {
    uVar4 = uVar3;
  }
  length = 1;
  while( true ) {
    if ((uVar4 * 0x10 == uVar3) ||
       (iVar1 = *(int *)((long)&this->ranges[0].length + uVar3), minLength + 1 < iVar1)) {
      return '\0';
    }
    iVar2 = *(int *)((long)&this->ranges[0].count + uVar3);
    iVar5 = n - iVar2;
    if (iVar5 == 0 || n < iVar2) break;
    uVar3 = uVar3 + 0x10;
    length = length + 1;
    n = iVar5;
  }
  if (minLength < iVar1) {
    *(int32_t *)((long)&this->ranges[0].count + uVar3) = n;
  }
  this->rangeCount = length;
  if (uVar3 == 0) {
    return '\x01';
  }
  errorCode = U_ZERO_ERROR;
  uprv_sortArray_63(this->ranges,length,0x10,compareRanges,(void *)0x0,'\0',&errorCode);
  return '\x01';
}

Assistant:

UBool
CollationWeights::allocWeightsInShortRanges(int32_t n, int32_t minLength) {
    // See if the first few minLength and minLength+1 ranges have enough weights.
    for(int32_t i = 0; i < rangeCount && ranges[i].length <= (minLength + 1); ++i) {
        if(n <= ranges[i].count) {
            // Use the first few minLength and minLength+1 ranges.
            if(ranges[i].length > minLength) {
                // Reduce the number of weights from the last minLength+1 range
                // which might sort before some minLength ranges,
                // so that we use all weights in the minLength ranges.
                ranges[i].count = n;
            }
            rangeCount = i + 1;
#ifdef UCOL_DEBUG
            printf("take first %ld ranges\n", rangeCount);
#endif

            if(rangeCount>1) {
                /* sort the ranges by weight values */
                UErrorCode errorCode=U_ZERO_ERROR;
                uprv_sortArray(ranges, rangeCount, sizeof(WeightRange),
                               compareRanges, NULL, FALSE, &errorCode);
                /* ignore error code: we know that the internal sort function will not fail here */
            }
            return TRUE;
        }
        n -= ranges[i].count;  // still >0
    }
    return FALSE;
}